

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat.c
# Opt level: O2

int Cbs_ManPropagate(Cbs_Man_t *p,int Level)

{
  Gia_Obj_t *pGVar1;
  Gia_Obj_t **ppGVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Gia_Obj_t *pGVar7;
  long lVar8;
  ulong uVar9;
  Gia_Obj_t *pRes1;
  long lVar10;
  
  do {
    for (lVar10 = (long)(p->pProp).iHead;
        (iVar4 = (p->pProp).iTail, lVar10 < iVar4 &&
        (pGVar1 = (p->pProp).pData[lVar10], pGVar1 != (Gia_Obj_t *)0x0)); lVar10 = lVar10 + 1) {
      if (((ulong)pGVar1 & 1) != 0) {
        __assert_fail("!Gia_IsComplement(pVar)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaCSat.c"
                      ,0x2de,"int Cbs_ManPropagateOne(Cbs_Man_t *, Gia_Obj_t *, int)");
      }
      uVar3 = (uint)*(undefined8 *)pGVar1;
      if ((uVar3 >> 0x1e & 1) == 0) {
        __assert_fail("Cbs_VarIsAssigned(pVar)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaCSat.c"
                      ,0x2df,"int Cbs_ManPropagateOne(Cbs_Man_t *, Gia_Obj_t *, int)");
      }
      if ((~uVar3 & 0x9fffffff) != 0) {
        if (((int)uVar3 < 0) || ((uVar3 & 0x1fffffff) == 0x1fffffff)) {
          __assert_fail("Gia_ObjIsAnd(pVar)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaCSat.c"
                        ,0x2e2,"int Cbs_ManPropagateOne(Cbs_Man_t *, Gia_Obj_t *, int)");
        }
        iVar4 = Cbs_VarFanin0Value(pGVar1);
        iVar5 = Cbs_VarFanin1Value(pGVar1);
        iVar6 = Cbs_VarValue(pGVar1);
        if (iVar6 == 0) {
          if (iVar5 != 0 && iVar4 != 0) {
            if (iVar5 == 1 && iVar4 == 1) {
LAB_0056dc16:
              uVar9 = *(ulong *)pGVar1 & 0x1fffffff;
              pGVar7 = pGVar1 + -(*(ulong *)pGVar1 >> 0x20 & 0x1fffffff);
              goto LAB_0056dc48;
            }
            if (iVar4 == 1 || iVar5 == 1) {
              if (iVar4 == 2) {
                uVar9 = *(ulong *)pGVar1;
                Cbs_ManAssign(p,(Gia_Obj_t *)
                                (((ulong)((uint)(uVar9 >> 0x1d) & 1) |
                                 (ulong)(pGVar1 + -(uVar9 & 0x1fffffff))) ^ 1),Level,pGVar1,
                              pGVar1 + -(uVar9 >> 0x20 & 0x1fffffff));
              }
              if (iVar5 == 2) {
                pGVar7 = Gia_ObjChild1(pGVar1);
                pGVar7 = (Gia_Obj_t *)((ulong)pGVar7 ^ 1);
                pRes1 = pGVar1 + -(ulong)((uint)*(undefined8 *)pGVar1 & 0x1fffffff);
                goto LAB_0056dbd3;
              }
            }
            else {
              iVar4 = Cbs_VarIsJust(pGVar1);
              if (iVar4 == 0) {
                __assert_fail("Cbs_VarIsJust(pVar)",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaCSat.c"
                              ,0x303,"int Cbs_ManPropagateOne(Cbs_Man_t *, Gia_Obj_t *, int)");
              }
              lVar8 = (long)(p->pJust).iHead;
              while ((lVar8 < (p->pJust).iTail &&
                     (pGVar7 = (p->pJust).pData[lVar8], pGVar7 != (Gia_Obj_t *)0x0))) {
                lVar8 = lVar8 + 1;
                if (pGVar7 == pGVar1) {
                  __assert_fail("!Cbs_QueHasNode( &p->pJust, pVar )",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaCSat.c"
                                ,0x304,"int Cbs_ManPropagateOne(Cbs_Man_t *, Gia_Obj_t *, int)");
                }
              }
              Cbs_QuePush(&p->pJust,pGVar1);
            }
          }
        }
        else if (iVar5 != 0 && iVar4 != 0) {
          if (iVar4 == 2) {
            Cbs_ManAssign(p,(Gia_Obj_t *)
                            ((ulong)((uint)*(undefined8 *)pGVar1 >> 0x1d & 1) |
                            (ulong)(pGVar1 + -(ulong)((uint)*(undefined8 *)pGVar1 & 0x1fffffff))),
                          Level,pGVar1,(Gia_Obj_t *)0x0);
          }
          if (iVar5 == 2) {
            pGVar7 = Gia_ObjChild1(pGVar1);
            pRes1 = (Gia_Obj_t *)0x0;
LAB_0056dbd3:
            Cbs_ManAssign(p,pGVar7,Level,pGVar1,pRes1);
          }
        }
        else {
          if (iVar5 == 0 || iVar4 != 0) {
            if (iVar4 == 0 || iVar5 != 0) {
              if (iVar4 != 0 || iVar5 != 0) {
                __assert_fail("Value0 == 0 && Value1 == 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaCSat.c"
                              ,0x2ed,"int Cbs_ManPropagateOne(Cbs_Man_t *, Gia_Obj_t *, int)");
              }
              goto LAB_0056dc16;
            }
            uVar3 = *(uint *)&pGVar1->field_0x4;
          }
          else {
            uVar3 = (uint)*(undefined8 *)pGVar1;
          }
          uVar9 = (ulong)(uVar3 & 0x1fffffff);
          pGVar7 = (Gia_Obj_t *)0x0;
LAB_0056dc48:
          iVar4 = Cbs_ManAnalyze(p,Level,pGVar1,pGVar1 + -uVar9,pGVar7);
          if (iVar4 != 0) {
            return iVar4;
          }
        }
      }
    }
    (p->pProp).iHead = iVar4;
    iVar4 = (p->pJust).iHead;
    for (lVar10 = (long)iVar4; iVar5 = (p->pJust).iTail, lVar10 < iVar5; lVar10 = lVar10 + 1) {
      ppGVar2 = (p->pJust).pData;
      pGVar1 = ppGVar2[lVar10];
      if (pGVar1 == (Gia_Obj_t *)0x0) break;
      iVar5 = Cbs_VarIsJust(pGVar1);
      if (iVar5 == 0) {
        if (((ulong)pGVar1 & 1) != 0) {
          __assert_fail("!Gia_IsComplement(pVar)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaCSat.c"
                        ,0x317,"int Cbs_ManPropagateTwo(Cbs_Man_t *, Gia_Obj_t *, int)");
        }
        uVar3 = (uint)*(undefined8 *)pGVar1;
        if (((int)uVar3 < 0) || ((uVar3 & 0x1fffffff) == 0x1fffffff)) {
          __assert_fail("Gia_ObjIsAnd(pVar)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaCSat.c"
                        ,0x318,"int Cbs_ManPropagateTwo(Cbs_Man_t *, Gia_Obj_t *, int)");
        }
        if ((uVar3 >> 0x1e & 1) == 0) {
          __assert_fail("Cbs_VarIsAssigned(pVar)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaCSat.c"
                        ,0x319,"int Cbs_ManPropagateTwo(Cbs_Man_t *, Gia_Obj_t *, int)");
        }
        iVar5 = Cbs_VarValue(pGVar1);
        if (iVar5 != 0) {
          __assert_fail("!Cbs_VarValue(pVar)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaCSat.c"
                        ,0x31a,"int Cbs_ManPropagateTwo(Cbs_Man_t *, Gia_Obj_t *, int)");
        }
        iVar5 = Cbs_VarFanin0Value(pGVar1);
        iVar6 = Cbs_VarFanin1Value(pGVar1);
        if (iVar6 != 0 && iVar5 != 0) {
          if (iVar6 == 1 && iVar5 == 1) {
            iVar5 = Cbs_ManAnalyze(p,Level,pGVar1,pGVar1 + -(*(ulong *)pGVar1 & 0x1fffffff),
                                   pGVar1 + -(*(ulong *)pGVar1 >> 0x20 & 0x1fffffff));
            if (iVar5 != 0) {
              return iVar5;
            }
          }
          else {
            if (iVar5 != 1 && iVar6 != 1) {
              __assert_fail("Value0 == 1 || Value1 == 1",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaCSat.c"
                            ,0x322,"int Cbs_ManPropagateTwo(Cbs_Man_t *, Gia_Obj_t *, int)");
            }
            if (iVar5 == 2) {
              uVar9 = *(ulong *)pGVar1;
              Cbs_ManAssign(p,(Gia_Obj_t *)
                              (((ulong)((uint)(uVar9 >> 0x1d) & 1) |
                               (ulong)(pGVar1 + -(uVar9 & 0x1fffffff))) ^ 1),Level,pGVar1,
                            pGVar1 + -(uVar9 >> 0x20 & 0x1fffffff));
            }
            if (iVar6 == 2) {
              pGVar7 = Gia_ObjChild1(pGVar1);
              Cbs_ManAssign(p,(Gia_Obj_t *)((ulong)pGVar7 ^ 1),Level,pGVar1,
                            pGVar1 + -(ulong)((uint)*(undefined8 *)pGVar1 & 0x1fffffff));
            }
          }
        }
      }
      else {
        lVar8 = (long)iVar4;
        iVar4 = iVar4 + 1;
        ppGVar2[lVar8] = pGVar1;
      }
    }
    if (iVar4 == iVar5) {
      return 0;
    }
    (p->pJust).iTail = iVar4;
  } while( true );
}

Assistant:

int Cbs_ManPropagate( Cbs_Man_t * p, int Level )
{
    int hClause;
    Gia_Obj_t * pVar;
    int i, k;
    while ( 1 )
    {
        Cbs_QueForEachEntry( p->pProp, pVar, i )
        {
            if ( (hClause = Cbs_ManPropagateOne( p, pVar, Level )) )
                return hClause;
        }
        p->pProp.iHead = p->pProp.iTail;
        k = p->pJust.iHead;
        Cbs_QueForEachEntry( p->pJust, pVar, i )
        {
            if ( Cbs_VarIsJust( pVar ) )
                p->pJust.pData[k++] = pVar;
            else if ( (hClause = Cbs_ManPropagateTwo( p, pVar, Level )) )
                return hClause;
        }
        if ( k == p->pJust.iTail )
            break;
        p->pJust.iTail = k;
    }
    return 0;
}